

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::Array<const_kj::StringPtr>::~Array(Array<const_kj::StringPtr> *this)

{
  StringPtr *pSVar1;
  size_t sVar2;
  
  pSVar1 = this->ptr;
  if (pSVar1 != (StringPtr *)0x0) {
    sVar2 = this->size_;
    this->ptr = (StringPtr *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pSVar1,0x10,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }